

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

IStreamingReporterPtr __thiscall
Catch::ListenerRegistrar<Catch2ApprovalListener>::ListenerFactory::create
          (ListenerFactory *this,ReporterConfig *config)

{
  unique_ptr<Catch2ApprovalListener,_std::default_delete<Catch2ApprovalListener>_> *__u;
  pointer in_RDI;
  _Head_base<0UL,_Catch::IStreamingReporter_*,_false> this_00;
  unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
  *in_stack_ffffffffffffffd0;
  
  this_00._M_head_impl = (IStreamingReporter *)in_RDI;
  __u = (unique_ptr<Catch2ApprovalListener,_std::default_delete<Catch2ApprovalListener>_> *)
        operator_new(0x1c0);
  Catch2ApprovalListener::TestEventListenerBase
            ((Catch2ApprovalListener *)this_00._M_head_impl,(ReporterConfig *)in_RDI);
  std::unique_ptr<Catch2ApprovalListener,std::default_delete<Catch2ApprovalListener>>::
  unique_ptr<std::default_delete<Catch2ApprovalListener>,void>
            ((unique_ptr<Catch2ApprovalListener,_std::default_delete<Catch2ApprovalListener>_> *)
             this_00._M_head_impl,in_RDI);
  std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>::
  unique_ptr<Catch2ApprovalListener,std::default_delete<Catch2ApprovalListener>,void>
            (in_stack_ffffffffffffffd0,__u);
  clara::std::unique_ptr<Catch2ApprovalListener,_std::default_delete<Catch2ApprovalListener>_>::
  ~unique_ptr((unique_ptr<Catch2ApprovalListener,_std::default_delete<Catch2ApprovalListener>_> *)
              this_00._M_head_impl);
  return (__uniq_ptr_data<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>,_true,_true>
          )(tuple<Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>)
           this_00._M_head_impl;
}

Assistant:

IStreamingReporterPtr create( ReporterConfig const& config ) const override {
                return std::unique_ptr<T>( new T( config ) );
            }